

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fsm.cpp
# Opt level: O0

void OutputNumber(ostream *strmOut,int nValue,int nSpaces)

{
  int in_EDX;
  int in_ESI;
  ostream *in_RDI;
  int i_1;
  int i;
  int cSpaces;
  int local_1c;
  int local_18;
  int local_14;
  
  if (0 < in_EDX) {
    local_14 = 0;
    if (99999999 < in_ESI) {
      local_14 = -1;
    }
    if (in_ESI < 10000000) {
      local_14 = local_14 + 1;
    }
    if (in_ESI < 1000000) {
      local_14 = local_14 + 1;
    }
    if (in_ESI < 100000) {
      local_14 = local_14 + 1;
    }
    if (in_ESI < 10000) {
      local_14 = local_14 + 1;
    }
    if (in_ESI < 1000) {
      local_14 = local_14 + 1;
    }
    if (in_ESI < 100) {
      local_14 = local_14 + 1;
    }
    if (in_ESI < 10) {
      local_14 = local_14 + 1;
    }
    local_14 = local_14 - (8 - in_EDX);
    if (local_14 < 0) {
      std::operator<<(in_RDI," ");
      for (local_18 = 1; local_18 < in_EDX; local_18 = local_18 + 1) {
        std::operator<<(in_RDI,"*");
      }
    }
    else {
      for (local_1c = 0; local_1c < local_14; local_1c = local_1c + 1) {
        std::operator<<(in_RDI," ");
      }
      std::ostream::operator<<(in_RDI,in_ESI);
    }
  }
  return;
}

Assistant:

void OutputNumber(std::ostream& strmOut, int nValue, int nSpaces)
{
	if (nSpaces < 1)
		return;

	Assert(nSpaces < 8);

	int cSpaces = 0;
	if (nValue >= 100000000)
		cSpaces--;
	if (nValue < 10000000)
		cSpaces++;
	if (nValue < 1000000)
		cSpaces++;
	if (nValue < 100000)
		cSpaces++;
	if (nValue < 10000)
		cSpaces++;
	if (nValue < 1000)
		cSpaces++;
	if (nValue < 100)
		cSpaces++;
	if (nValue < 10)
		cSpaces++;

	cSpaces = cSpaces - (8 - nSpaces);

	if (cSpaces < 0)
	{
		strmOut << " ";
		for (int i = 1; i < nSpaces; i++) strmOut << "*";
		return;
	}

	for (int i = 0; i < cSpaces; i++) strmOut << " ";
	strmOut << nValue;
}